

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::Average::dim_forward
          (Dim *__return_storage_ptr__,Average *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs
          )

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  ulong uVar5;
  ostream *os;
  invalid_argument *this_00;
  pointer pDVar6;
  uint uVar7;
  Dim r_1;
  Dim r;
  
  pDVar6 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = pDVar6->bd;
  __return_storage_ptr__->bd = uVar7;
  uVar1 = *(undefined8 *)(pDVar6->d + 2);
  uVar2 = *(undefined8 *)(pDVar6->d + 4);
  uVar3 = *(undefined8 *)(pDVar6->d + 6);
  *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)pDVar6->d;
  *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar1;
  *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar2;
  *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar3;
  uVar5 = 1;
  while( true ) {
    if ((ulong)(((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pDVar6) / 0x24) <= uVar5) {
      __return_storage_ptr__->bd = uVar7;
      return __return_storage_ptr__;
    }
    r.d._0_8_ = *(undefined8 *)pDVar6->d;
    r.d._8_8_ = *(undefined8 *)(pDVar6->d + 2);
    r.d._16_8_ = *(undefined8 *)(pDVar6->d + 4);
    r._24_8_ = *(undefined8 *)(pDVar6->d + 6);
    r_1.d._0_8_ = *(undefined8 *)pDVar6[1].d;
    r_1.d._8_8_ = *(undefined8 *)(pDVar6[1].d + 2);
    r_1.d._16_8_ = *(undefined8 *)(pDVar6[1].d + 4);
    r_1._24_8_ = *(undefined8 *)(pDVar6[1].d + 6);
    r_1.bd = 1;
    r.bd = 1;
    bVar4 = operator!=(&r,&r_1);
    if (bVar4) break;
    pDVar6 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar7 < pDVar6[uVar5].bd) {
      uVar7 = pDVar6[uVar5].bd;
    }
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  __return_storage_ptr__->bd = uVar7;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&r);
  os = std::operator<<((ostream *)&r,"Mismatched input dimensions in Average: ");
  operator<<(os,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,(string *)&r_1);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim Average::dim_forward(const vector<Dim>& xs) const {
  Dim d(xs[0]);
  for (unsigned i = 1; i < xs.size(); ++i) {
    if (xs[0].single_batch() != xs[1].single_batch()) {
      ostringstream s; s << "Mismatched input dimensions in Average: " << xs;
      throw std::invalid_argument(s.str());
    }
    d.bd = max(xs[i].bd, d.bd);
  }
  return d;
}